

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::ifStmt(Parser *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Report *this_00;
  undefined4 uVar7;
  undefined8 uVar8;
  ASTNode *pAVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  int iVar12;
  LiteralType args;
  Expr *pEVar13;
  _Base_ptr p_Var14;
  _Head_base<0UL,_flow::lang::Expr_*,_false> _Var15;
  undefined8 *puVar16;
  pointer *__ptr;
  Parser *in_RSI;
  Lexer *pLVar17;
  size_type __dnew;
  SourceLocation sloc;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_98;
  _Base_ptr local_90;
  string local_88;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_68;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_60;
  undefined1 local_58 [40];
  
  pLVar17 = (in_RSI->lexer_)._M_t.
            super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
            super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
            super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_68._M_head_impl = (Lexer *)local_58;
  lVar4 = *(long *)&(pLVar17->location_).filename._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,lVar4,(pLVar17->location_).filename._M_string_length + lVar4);
  uVar1 = (pLVar17->location_).end.column;
  uVar5 = (pLVar17->location_).end.offset;
  local_58._16_8_ = *(undefined8 *)&(pLVar17->location_).begin;
  uVar8 = *(undefined8 *)&(pLVar17->location_).begin.offset;
  local_58._24_4_ = (undefined4)uVar8;
  local_58._28_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_58._32_4_ = uVar1;
  local_58._36_4_ = uVar5;
  bVar11 = expect(in_RSI,If);
  if (bVar11) {
    Lexer::nextToken((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  }
  logicExpr((Parser *)&local_98);
  pLVar17 = (in_RSI->lexer_)._M_t.
            super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
            super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
            super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  if (pLVar17->token_ == Then) {
    Lexer::nextToken(pLVar17);
  }
  iVar12 = (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[3])
                     ();
  _Var15._M_head_impl = local_98._M_head_impl;
  if (iVar12 == 1) {
LAB_0012e940:
    local_98._M_head_impl = _Var15._M_head_impl;
    stmt((Parser *)&local_88);
    _Var10._M_p = local_88._M_dataplus._M_p;
    if ((_Base_ptr)local_88._M_dataplus._M_p != (_Base_ptr)0x0) {
      pLVar17 = (in_RSI->lexer_)._M_t.
                super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                _M_t.
                super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      if (pLVar17->token_ == Else) {
        Lexer::nextToken(pLVar17);
        stmt((Parser *)&local_90);
        if (local_90 == (_Base_ptr)0x0) {
          *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
          (**(code **)(*(long *)_Var10._M_p + 8))(_Var10._M_p);
          goto LAB_0012eace;
        }
        pLVar17 = (in_RSI->lexer_)._M_t.
                  super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        p_Var14 = local_90;
      }
      else {
        p_Var14 = (_Base_ptr)0x0;
      }
      local_58._36_4_ = (pLVar17->lastLocation_).end.offset;
      uVar3 = (pLVar17->lastLocation_).end.line;
      uVar7 = (pLVar17->lastLocation_).end.column;
      local_58._28_4_ = uVar3;
      local_58._32_4_ = uVar7;
      puVar16 = (undefined8 *)operator_new(0x58);
      _Var15._M_head_impl = local_98._M_head_impl;
      local_98._M_head_impl = (Expr *)0x0;
      *puVar16 = &PTR__ASTNode_001ae890;
      puVar16[1] = puVar16 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar16 + 1),local_68._M_head_impl,
                 (undefined1 *)
                 ((long)&(local_68._M_head_impl)->report_ + (long)local_60._M_head_impl));
      puVar16[7] = CONCAT44(local_58._36_4_,local_58._32_4_);
      puVar16[5] = local_58._16_8_;
      puVar16[6] = CONCAT44(local_58._28_4_,local_58._24_4_);
      *puVar16 = &PTR__CondStmt_001aee50;
      puVar16[8] = _Var15._M_head_impl;
      puVar16[9] = _Var10._M_p;
      puVar16[10] = p_Var14;
      *(undefined8 **)&(this->features_)._M_t._M_impl = puVar16;
      goto LAB_0012eace;
    }
  }
  else {
    if (iVar12 == 3) {
      pLVar17 = (in_RSI->lexer_)._M_t.
                super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                _M_t.
                super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      local_58._36_4_ = (pLVar17->lastLocation_).end.offset;
      uVar2 = (pLVar17->lastLocation_).end.line;
      uVar6 = (pLVar17->lastLocation_).end.column;
      local_58._28_4_ = uVar2;
      local_58._32_4_ = uVar6;
      pEVar13 = (Expr *)operator_new(0x50);
      (pEVar13->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
      (pEVar13->super_ASTNode).location_.filename._M_dataplus._M_p =
           (pointer)&(pEVar13->super_ASTNode).location_.filename.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pEVar13->super_ASTNode).location_,local_68._M_head_impl,
                 (undefined1 *)((long)local_60._M_head_impl + (long)local_68._M_head_impl));
      (pEVar13->super_ASTNode).location_.end.column = local_58._32_4_;
      (pEVar13->super_ASTNode).location_.end.offset = local_58._36_4_;
      (pEVar13->super_ASTNode).location_.begin.line = local_58._16_4_;
      (pEVar13->super_ASTNode).location_.begin.column = local_58._20_4_;
      *(ulong *)&(pEVar13->super_ASTNode).location_.begin.offset =
           CONCAT44(local_58._28_4_,local_58._24_4_);
      (pEVar13->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__UnaryExpr_001aec28;
      *(undefined2 *)&pEVar13[1].super_ASTNode._vptr_ASTNode = 0x37;
      pEVar13[1].super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)local_98._M_head_impl;
      local_98._M_head_impl = pEVar13;
      p_Var14 = (_Base_ptr)operator_new(0x48);
      *(undefined ***)&p_Var14->_M_color = &PTR__ASTNode_001ae890;
      p_Var14->_M_parent = (_Base_ptr)&p_Var14->_M_right;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var14->_M_parent,local_68._M_head_impl,
                 (undefined1 *)
                 ((long)&(((list_type *)&(local_60._M_head_impl)->report_)->
                         super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)local_68._M_head_impl));
      p_Var14[1]._M_right = (_Base_ptr)CONCAT44(local_58._36_4_,local_58._32_4_);
      p_Var14[1]._M_parent = (_Base_ptr)local_58._16_8_;
      p_Var14[1]._M_left = (_Base_ptr)CONCAT44(local_58._28_4_,local_58._24_4_);
      *(undefined ***)&p_Var14->_M_color = &PTR__ASTNode_001ae8e8;
      *(long *)&p_Var14[2]._M_color = 0;
      _Var15._M_head_impl = (Expr *)operator_new(0x58);
      local_88._M_dataplus._M_p = (pointer)p_Var14;
      BinaryExpr::BinaryExpr
                ((BinaryExpr *)_Var15._M_head_impl,NCMPNE,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_98,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_88);
      if ((_Base_ptr)local_88._M_dataplus._M_p != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
      }
      if (local_98._M_head_impl != (Expr *)0x0) {
        pAVar9 = &(local_98._M_head_impl)->super_ASTNode;
        local_98._M_head_impl = _Var15._M_head_impl;
        (*pAVar9->_vptr_ASTNode[1])();
        _Var15._M_head_impl = local_98._M_head_impl;
      }
      goto LAB_0012e940;
    }
    pLVar17 = (in_RSI->lexer_)._M_t.
              super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t
              .super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
              super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    this_00 = in_RSI->report_;
    local_90 = (_Base_ptr)0x3d;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_90);
    local_88.field_2._M_allocated_capacity = (size_type)local_90;
    builtin_strncpy((char *)((long)&((_Base_ptr)((long)local_88._M_dataplus._M_p + 0x20))->_M_parent
                            + 5),"type {} ",8);
    builtin_strncpy((char *)((long)&((_Base_ptr)((long)local_88._M_dataplus._M_p + 0x20))->_M_left +
                            5),"instead.",8);
    *(undefined8 *)((long)local_88._M_dataplus._M_p + 0x20) = 0x65636552202e6570;
    ((_Base_ptr)((long)local_88._M_dataplus._M_p + 0x20))->_M_parent = (_Base_ptr)0x7079742064657669
    ;
    ((_Base_ptr)local_88._M_dataplus._M_p)->_M_left = (_Base_ptr)0x6f62206562207473;
    ((_Base_ptr)local_88._M_dataplus._M_p)->_M_right = (_Base_ptr)0x7974206e61656c6f;
    ((_Base_ptr)local_88._M_dataplus._M_p)->_M_color = 0x65206649;
    ((_Base_ptr)local_88._M_dataplus._M_p)->field_0x4 = 'x';
    ((_Base_ptr)local_88._M_dataplus._M_p)->field_0x5 = 'p';
    ((_Base_ptr)local_88._M_dataplus._M_p)->field_0x6 = 'r';
    ((_Base_ptr)local_88._M_dataplus._M_p)->field_0x7 = 'e';
    *(undefined4 *)&((_Base_ptr)local_88._M_dataplus._M_p)->_M_parent = 0x6f697373;
    *(undefined4 *)((long)&((_Base_ptr)local_88._M_dataplus._M_p)->_M_parent + 4) = 0x756d206e;
    local_88._M_string_length = (size_type)local_90;
    *(undefined1 *)((long)&local_90->_M_color + (long)local_88._M_dataplus._M_p) = 0;
    args = (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[3])
                     ();
    diagnostics::Report::typeError<flow::LiteralType>
              (this_00,&pLVar17->lastLocation_,&local_88,args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
LAB_0012eace:
  if ((BinaryExpr *)local_98._M_head_impl != (BinaryExpr *)0x0) {
    (*((ASTNode *)&((local_98._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[1])();
  }
  if (local_68._M_head_impl != (Lexer *)local_58) {
    operator_delete(local_68._M_head_impl,(ulong)((long)(Report **)local_58._0_8_ + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::ifStmt() {
  // ifStmt ::= 'if' expr ['then'] stmt ['else' stmt]
  SourceLocation sloc(location());

  consume(Token::If);
  std::unique_ptr<Expr> cond(expr());
  consumeIf(Token::Then);

  switch (cond->getType()) {
    case LiteralType::Boolean:
      break;
    case LiteralType::String:
      cond = std::make_unique<UnaryExpr>(Opcode::SLEN, std::move(cond), sloc.update(end()));
      cond = std::make_unique<BinaryExpr>(Opcode::NCMPNE, std::move(cond),
          std::make_unique<NumberExpr>(0, sloc));
      break;
    default:
      report_.typeError(
          lastLocation(),
          "If expression must be boolean type. Received type {} instead.",
          cond->getType());
      return nullptr;
  }

  std::unique_ptr<Stmt> thenStmt(stmt());
  if (!thenStmt) return nullptr;

  std::unique_ptr<Stmt> elseStmt;

  if (consumeIf(Token::Else)) {
    elseStmt = stmt();
    if (!elseStmt) {
      return nullptr;
    }
  }

  return std::make_unique<CondStmt>(std::move(cond), std::move(thenStmt),
                                    std::move(elseStmt), sloc.update(end()));
}